

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmeticencoder.cpp
# Opt level: O1

void __thiscall ArithmeticEncoder::writeBits(ArithmeticEncoder *this,U32 bits,U32 sym)

{
  U32 *pUVar1;
  uint uVar2;
  U8 *pUVar3;
  uint uVar4;
  U8 *pUVar5;
  
  if ((0x1f < bits - 1) || (sym >> ((byte)bits & 0x1f) != 0)) {
    __assert_fail("bits && (bits <= 32) && (sym < (1u<<bits))",
                  "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/arithmeticencoder.cpp"
                  ,0x103,"void ArithmeticEncoder::writeBits(U32, U32)");
  }
  if (0x13 < bits) {
    writeShort(this,(U16)sym);
    sym = sym >> 0x10;
    bits = bits - 0x10;
  }
  uVar4 = this->length >> ((byte)bits & 0x1f);
  this->length = uVar4;
  uVar4 = uVar4 * sym;
  pUVar1 = &this->base;
  uVar2 = *pUVar1;
  *pUVar1 = *pUVar1 + uVar4;
  if (CARRY4(uVar2,uVar4)) {
    pUVar5 = this->outbyte;
    if (pUVar5 == this->outbuffer) {
      pUVar5 = this->endbuffer;
    }
    pUVar5 = pUVar5 + -1;
    while (*pUVar5 == 0xff) {
      *pUVar5 = '\0';
      pUVar3 = this->endbuffer;
      if (pUVar5 == this->outbuffer) {
        pUVar5 = pUVar3;
      }
      pUVar5 = pUVar5 + -1;
      if (pUVar5 < this->outbuffer) {
        __assert_fail("outbuffer <= p",
                      "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/arithmeticencoder.cpp"
                      ,0x14d,"void ArithmeticEncoder::propagate_carry()");
      }
      if (pUVar3 <= pUVar5) {
        __assert_fail("p < endbuffer",
                      "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/arithmeticencoder.cpp"
                      ,0x14e,"void ArithmeticEncoder::propagate_carry()");
      }
      if (pUVar3 <= this->outbyte) {
        __assert_fail("outbyte < endbuffer",
                      "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/arithmeticencoder.cpp"
                      ,0x14f,"void ArithmeticEncoder::propagate_carry()");
      }
    }
    *pUVar5 = *pUVar5 + '\x01';
  }
  if (this->length < 0x1000000) {
    renorm_enc_interval(this);
    return;
  }
  return;
}

Assistant:

void ArithmeticEncoder::writeBits(U32 bits, U32 sym)
{
  assert(bits && (bits <= 32) && (sym < (1u<<bits)));

  if (bits > 19)
  {
    writeShort(sym&U16_MAX);
    sym = sym >> 16;
    bits = bits - 16;
  }

  U32 init_base = base;
  base += sym * (length >>= bits);             // new interval base and length

  if (init_base > base) propagate_carry();                 // overflow = carry
  if (length < AC__MinLength) renorm_enc_interval();        // renormalization
}